

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void __thiscall rw::World::addLight(World *this,Light *light)

{
  long lVar1;
  LLLink *pLVar2;
  byte bVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  
  light->world = this;
  pLVar2 = &light->inWorld;
  if (-1 < (char)(light->object).object.subType) {
    (light->inWorld).next = &(this->globalLights).link;
    (light->inWorld).prev = (this->globalLights).link.prev;
    ((this->globalLights).link.prev)->next = pLVar2;
    (this->globalLights).link.prev = pLVar2;
    return;
  }
  (light->inWorld).next = &(this->localLights).link;
  (light->inWorld).prev = (this->localLights).link.prev;
  ((this->localLights).link.prev)->next = pLVar2;
  (this->localLights).link.prev = pLVar2;
  lVar6 = engine;
  pvVar5 = (light->object).object.parent;
  if (pvVar5 == (void *)0x0) {
    return;
  }
  lVar4 = *(long *)((long)pvVar5 + 0xc0);
  bVar3 = *(byte *)(lVar4 + 3);
  if ((bVar3 & 3) == 0) {
    lVar1 = engine + 0x10;
    *(undefined8 *)(lVar4 + 0x10) = *(undefined8 *)(engine + 0x10);
    *(long *)(lVar4 + 0x18) = lVar1;
    *(long *)(*(long *)(lVar6 + 0x10) + 8) = lVar4 + 0x10;
    *(long *)(lVar6 + 0x10) = lVar4 + 0x10;
  }
  *(byte *)(lVar4 + 3) = bVar3 | 3;
  *(byte *)((long)pvVar5 + 3) = *(byte *)((long)pvVar5 + 3) | 0xc;
  return;
}

Assistant:

void
World::addLight(Light *light)
{
	assert(light->world == nil);
	light->world = this;
	if(light->getType() < Light::POINT){
		this->globalLights.append(&light->inWorld);
	}else{
		this->localLights.append(&light->inWorld);
		if(light->getFrame())
			light->getFrame()->updateObjects();
	}
}